

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::buildSelect(TranslateToFuzzReader *this,ThreeArgs *args)

{
  Select *pSVar1;
  ThreeArgs *args_local;
  TranslateToFuzzReader *this_local;
  
  pSVar1 = Builder::makeSelect(&this->builder,args->a,args->b,args->c);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::buildSelect(const ThreeArgs& args) {
  return builder.makeSelect(args.a, args.b, args.c);
}